

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QToolBarAreaLayout::unplug(QToolBarAreaLayout *this,QList<int> *path,QToolBarAreaLayout *other)

{
  int iVar1;
  Orientation OVar2;
  int *piVar3;
  QToolBarAreaLayoutItem *pQVar4;
  long *plVar5;
  Representation RVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  QToolBarAreaLayoutItem *this_00;
  pointer pQVar10;
  QSize QVar11;
  pointer pQVar12;
  QSize QVar13;
  QToolBarAreaLayoutItem *pQVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int local_7c;
  
  this_00 = item(this,path);
  piVar3 = (path->d).ptr;
  iVar1 = piVar3[1];
  pQVar10 = QList<QToolBarAreaLayoutLine>::data(&this->docks[*piVar3].lines);
  iVar9 = this_00->size;
  OVar2 = pQVar10[iVar1].o;
  QVar11 = QToolBarAreaLayoutItem::realSizeHint(this_00);
  RVar6 = QVar11.ht.m_i;
  if (OVar2 == Horizontal) {
    RVar6 = QVar11.wd.m_i;
  }
  if (iVar9 != RVar6.m_i) {
    uVar17 = (ulong)(uint)(path->d).ptr[2];
    local_7c = 0;
    do {
      if ((int)uVar17 < 1) break;
      pQVar12 = QList<QToolBarAreaLayoutItem>::data(&pQVar10[iVar1].toolBarItems);
      pQVar14 = pQVar12 + (uVar17 - 1);
      if (pQVar12[uVar17 - 1].gap == false) {
        if (pQVar14->widgetItem == (QLayoutItem *)0x0) {
          cVar8 = '\x01';
        }
        else {
          iVar9 = (*pQVar14->widgetItem->_vptr_QLayoutItem[8])();
          cVar8 = (char)iVar9;
        }
      }
      else {
        cVar8 = '\0';
      }
      if (cVar8 == '\0') {
        lVar15 = (long)(path->d).ptr[2];
        lVar16 = lVar15 * 0x18 + 0x2c;
        do {
          lVar15 = lVar15 + 1;
          if (pQVar10[iVar1].toolBarItems.d.size <= lVar15) break;
          pQVar4 = pQVar10[iVar1].toolBarItems.d.ptr;
          if (*(char *)((long)&pQVar4->widgetItem + lVar16) == '\0') {
            plVar5 = *(long **)((long)pQVar4 + lVar16 + -0x14);
            if (plVar5 == (long *)0x0) {
              cVar7 = '\x01';
            }
            else {
              cVar7 = (**(code **)(*plVar5 + 0x40))();
            }
          }
          else {
            cVar7 = '\0';
          }
          if (cVar7 == '\0') {
            local_7c = *(int *)((long)pQVar4 + lVar16 + -0xc);
            iVar9 = pQVar12[uVar17 - 1].pos;
            OVar2 = pQVar10[iVar1].o;
            QVar11 = QToolBarAreaLayoutItem::sizeHint(pQVar14);
            RVar6 = QVar11.ht.m_i;
            if (OVar2 == Horizontal) {
              RVar6 = QVar11.wd.m_i;
            }
            local_7c = local_7c - (RVar6.m_i + iVar9);
            QToolBarAreaLayoutItem::resize
                      (pQVar14,pQVar10[iVar1].o,
                       *(int *)((long)pQVar4 + lVar16 + -0xc) - pQVar12[uVar17 - 1].pos);
          }
          lVar16 = lVar16 + 0x18;
        } while (cVar7 != '\0');
      }
      uVar17 = uVar17 - 1;
    } while (cVar8 != '\0');
    if (other != (QToolBarAreaLayout *)0x0) {
      piVar3 = (path->d).ptr;
      iVar1 = piVar3[1];
      pQVar10 = QList<QToolBarAreaLayoutLine>::data(&other->docks[*piVar3].lines);
      lVar16 = (long)(path->d).ptr[2];
      if (0 < lVar16) {
        lVar15 = lVar16 + 1;
        lVar16 = lVar16 * 0x18;
        do {
          pQVar12 = QList<QToolBarAreaLayoutItem>::data(&pQVar10[iVar1].toolBarItems);
          if (((&pQVar12[-1].gap)[lVar16] != false) ||
             ((plVar5 = *(long **)((long)&pQVar12[-1].widgetItem + lVar16), plVar5 != (long *)0x0 &&
              (cVar8 = (**(code **)(*plVar5 + 0x40))(), cVar8 == '\0')))) {
            OVar2 = pQVar10[iVar1].o;
            pQVar14 = (QToolBarAreaLayoutItem *)((long)&pQVar12[-1].widgetItem + lVar16);
            QVar13 = QToolBarAreaLayoutItem::sizeHint(pQVar14);
            QVar11 = (QSize)((ulong)QVar13 >> 0x20);
            if (OVar2 == Horizontal) {
              QVar11 = QVar13;
            }
            QToolBarAreaLayoutItem::resize(pQVar14,OVar2,local_7c + QVar11.wd.m_i.m_i);
            break;
          }
          lVar15 = lVar15 + -1;
          lVar16 = lVar16 + -0x18;
        } while (1 < lVar15);
      }
    }
  }
  this_00->gap = true;
  return this_00->widgetItem;
}

Assistant:

QLayoutItem *QToolBarAreaLayout::unplug(const QList<int> &path, QToolBarAreaLayout *other)
{
    //other needs to be update as well
    Q_ASSERT(path.size() == 3);
    QToolBarAreaLayoutItem *item = this->item(path);
    Q_ASSERT(item);

    //update the leading space here
    QToolBarAreaLayoutInfo &info = docks[path.at(0)];
    QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
    if (item->size != pick(line.o, item->realSizeHint())) {
        //the item doesn't have its default size
        //so we'll give this to the next item
        int newExtraSpace = 0;
        //let's iterate over the siblings of the current item that pare placed before it
        //we need to find just the one before
        for (int i = path.at(2) - 1; i >= 0; --i) {
            QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
            if (!previous.skip()) {
                //we need to check if it has a previous element and a next one
                //the previous will get its size changed
                for (int j = path.at(2) + 1; j < line.toolBarItems.size(); ++j) {
                    const QToolBarAreaLayoutItem &next = line.toolBarItems.at(j);
                    if (!next.skip()) {
                        newExtraSpace = next.pos - previous.pos - pick(line.o, previous.sizeHint());
                        previous.resize(line.o, next.pos - previous.pos);
                        break;
                    }
                }
                break;
            }
        }

        if (other) {
            QToolBarAreaLayoutInfo &info = other->docks[path.at(0)];
            QToolBarAreaLayoutLine &line = info.lines[path.at(1)];
            for (int i = path.at(2) - 1; i >= 0; --i) {
                QToolBarAreaLayoutItem &previous = line.toolBarItems[i];
                if (!previous.skip()) {
                    previous.resize(line.o, pick(line.o, previous.sizeHint()) + newExtraSpace);
                    break;
                }
            }

        }
    }

    Q_ASSERT(!item->gap);
    item->gap = true;
    return item->widgetItem;
}